

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManFirstFanouts(Gia_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  Gia_Obj_t *pGVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nCap = uVar3;
  if (uVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
    pVVar4->pArray = __s;
    pVVar4->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_0024537d;
    }
  }
  __s = (int *)0x0;
LAB_0024537d:
  if ((0 < (int)uVar1) && (pGVar5 = p->pObjs, pGVar5 != (Gia_Obj_t *)0x0)) {
    lVar7 = 0;
    uVar3 = uVar1;
    do {
      uVar8 = (uint)*(ulong *)pGVar5;
      uVar9 = *(ulong *)pGVar5 & 0x1fffffff;
      iVar6 = (int)lVar7;
      if (uVar9 == 0x1fffffff || (int)uVar8 < 0) {
        if ((int)uVar8 < 0 && (int)uVar9 != 0x1fffffff) {
          uVar8 = iVar6 - (uVar8 & 0x1fffffff);
          if (uVar1 <= uVar8) goto LAB_002454b2;
          if (__s[uVar8] == 0) {
            __s[uVar8] = iVar6;
            uVar3 = p->nObjs;
          }
        }
      }
      else {
        uVar8 = iVar6 - (uVar8 & 0x1fffffff);
        if (uVar1 <= uVar8) {
LAB_002454b2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (__s[uVar8] == 0) {
          __s[uVar8] = iVar6;
        }
        if ((int)uVar3 <= lVar7) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar9 = (ulong)-(*(uint *)&pGVar5->field_0x4 & 0x1fffffff) + lVar7;
        uVar8 = (uint)uVar9;
        if (((int)uVar8 < 0) || (uVar1 <= uVar8)) goto LAB_002454b2;
        uVar9 = uVar9 & 0xffffffff;
        if (__s[uVar9] == 0) {
          __s[uVar9] = iVar6;
        }
        puVar2 = p->pMuxes;
        if ((puVar2 != (uint *)0x0) && (puVar2[lVar7] != 0)) {
          uVar8 = puVar2[lVar7];
          if (uVar8 == 0) goto LAB_002454b2;
          if ((int)uVar8 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = uVar8 >> 1;
          if (uVar1 <= uVar8) goto LAB_002454b2;
          if (__s[uVar8] == 0) {
            __s[uVar8] = iVar6;
          }
        }
      }
      lVar7 = lVar7 + 1;
      pGVar5 = pGVar5 + 1;
    } while (lVar7 < (int)uVar3);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_ManFirstFanouts( Gia_Man_t * p )
{
    Vec_Int_t * vFans = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId1p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId1p(p, pObj), i);
            if ( Gia_ObjIsMuxId(p, i) && Vec_IntEntry(vFans, Gia_ObjFaninId2p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId2p(p, pObj), i);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
        }
    }
    return vFans;
}